

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_function_prototype
          (CompilerMSL *this,SPIRFunction *func,Bitset *param_2)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_t sVar1;
  uint *puVar2;
  Variant *pVVar3;
  SPIRFunction *pSVar4;
  uint uVar5;
  SPIRType *type;
  SPIRVariable *pSVar6;
  MSLConstexprSampler *pMVar7;
  const_iterator cVar8;
  uint id;
  char (*pacVar9) [16];
  ulong uVar10;
  string *in_R8;
  string *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  _Hash_node_base *p_Var11;
  long lVar12;
  __hashtable *__h;
  Parameter *arg;
  bool bVar13;
  __node_gen_type __node_gen;
  string decl;
  char *sampler_address_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string local_e8;
  char local_c1;
  SPIRFunction *local_c0;
  SPIRType *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Parameter *local_50;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  char *local_38;
  
  if ((func->super_IVariant).self.id !=
      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id) {
    CompilerGLSL::add_function_overload(&this->super_CompilerGLSL,func);
  }
  this_00 = &(this->super_CompilerGLSL).local_variable_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_00,&(this->super_CompilerGLSL).resource_names._M_h);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  bVar13 = (func->super_IVariant).self.id ==
           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  (this->super_CompilerGLSL).processing_entry_point = bVar13;
  if (!bVar13) {
    CompilerGLSL::statement<char_const*&>(&this->super_CompilerGLSL,&force_inline);
  }
  local_c0 = func;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(func->super_IVariant).field_0xc);
  if (((type->array).super_VectorView<unsigned_int>.buffer_size == 0) ||
     ((this->msl_options).force_native_arrays != true)) {
    func_type_decl_abi_cxx11_(&local_e8,this,type);
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
  }
  else {
    ::std::__cxx11::string::append((char *)&local_b0);
  }
  ::std::__cxx11::string::append((char *)&local_b0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&local_e8,this,(ulong)(local_c0->super_IVariant).self.id,1);
  ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)&local_b0);
  if (((type->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     ((this->msl_options).force_native_arrays == true)) {
    ::std::__cxx11::string::append((char *)&local_b0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_e8,this,type,0);
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)&local_b0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(&local_e8,this,type);
    ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
    pSVar4 = local_c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((pSVar4->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size != 0)
    {
      ::std::__cxx11::string::append((char *)&local_b0);
    }
  }
  if ((this->super_CompilerGLSL).processing_entry_point == true) {
    if ((this->msl_options).argument_buffers == true) {
      entry_point_args_argument_buffer_abi_cxx11_
                (&local_e8,this,
                 (local_c0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
    }
    else {
      entry_point_args_classic_abi_cxx11_
                (&local_e8,this,
                 (local_c0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                 buffer_size != 0);
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    p_Var11 = (this->super_CompilerGLSL).resource_names._M_h._M_before_begin._M_nxt;
    local_e8._M_dataplus._M_p = (pointer)this_00;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      do {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)this_00,p_Var11 + 1,&local_e8);
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
    }
    sVar1 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    if (sVar1 != 0) {
      puVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr;
      lVar12 = 0;
      do {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)((long)puVar2 + lVar12));
        uVar5 = (pSVar6->initializer).id;
        if (uVar5 == 0) {
          uVar5 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
          (pSVar6->initializer).id = uVar5;
        }
        if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr[uVar5].type & ~TypeExpression) == TypeNone) {
          local_e8._M_dataplus._M_p._0_1_ = 1;
          in_R8 = &local_e8;
          Compiler::
          set<spirv_cross::SPIRExpression,char_const(&)[3],spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                    ((Compiler *)this,uVar5,(char (*) [3])0x355945,
                     (TypedID<(spirv_cross::Types)1> *)&(pSVar6->super_IVariant).field_0xc,
                     (bool *)in_R8);
        }
        lVar12 = lVar12 + 4;
      } while (sVar1 << 2 != lVar12);
    }
  }
  sVar1 = (local_c0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  if (sVar1 != 0) {
    arg = (local_c0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
    local_50 = arg + sVar1;
    local_40 = &this->plane_name_suffix;
    local_48 = &(this->buffers_requiring_array_length)._M_h;
    do {
      uVar5 = (arg->id).id;
      uVar10 = (ulong)uVar5;
      id = uVar5;
      if ((uVar10 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar10].type == TypeVariable))
      {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar10);
        id = (pSVar6->basevariable).id;
        if (id == 0) {
          id = uVar5;
        }
        if (arg->alias_global_variable == false) {
          id = uVar5;
        }
        pSVar6->parameter = arg;
      }
      CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,id);
      argument_decl_abi_cxx11_(&local_e8,this,arg);
      ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      bVar13 = Compiler::has_extended_decoration
                         ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler);
      local_b8 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
      local_c1 = bVar13;
      if (*(int *)&(local_b8->super_IVariant).field_0xc == 0x11 && !bVar13) {
        pMVar7 = find_constexpr_sampler(this,id);
        if ((pMVar7 != (MSLConstexprSampler *)0x0) && (pMVar7->ycbcr_conversion_enable != false)) {
          uVar5 = pMVar7->planes;
          local_70._M_dataplus._M_p._0_4_ = 1;
          if (1 < uVar5) {
            do {
              argument_decl_abi_cxx11_(&local_90,this,arg);
              in_R8 = &local_70;
              join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                        (&local_e8,(spirv_cross *)0x35c44c,(char (*) [3])&local_90,local_40,in_R8,
                         (uint *)in_R9);
              ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              local_70._M_dataplus._M_p._0_4_ = (uint)local_70._M_dataplus._M_p + 1;
            } while ((uint)local_70._M_dataplus._M_p < uVar5);
          }
        }
        __return_storage_ptr__ = &local_70;
        if ((local_b8->image).dim != DimBuffer) {
          if ((local_b8->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            sampler_type_abi_cxx11_(&local_90,this,local_b8,(arg->id).id);
            to_sampler_expression_abi_cxx11_(__return_storage_ptr__,this,(arg->id).id);
            join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                      (&local_e8,(spirv_cross *)0x35c44c,(char (*) [3])&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37
                       ,(char (*) [2])__return_storage_ptr__,in_R9);
            ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
            in_R8 = __return_storage_ptr__;
          }
          else {
            local_38 = descriptor_address_space(this,id,StorageClassUniformConstant,"thread const");
            sampler_type_abi_cxx11_(&local_90,this,local_b8,(arg->id).id);
            to_sampler_expression_abi_cxx11_(__return_storage_ptr__,this,(arg->id).id);
            in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35b16b;
            in_R8 = &local_90;
            join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                      (&local_e8,(spirv_cross *)0x35c44c,(char (*) [3])&local_38,(char **)0x345c37,
                       (char (*) [2])&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35b16b
                       ,(char (*) [3])__return_storage_ptr__,in_stack_ffffffffffffff10);
            ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p
                                    ));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
      }
      if (((this->msl_options).swizzle_texture_samples == true) &&
         (this->has_sampled_images == true)) {
        bVar13 = Compiler::is_sampled_image_type((Compiler *)this,local_b8);
        if (local_c1 == '\0' && bVar13) {
          sVar1 = (local_b8->array).super_VectorView<unsigned_int>.buffer_size;
          to_swizzle_expression_abi_cxx11_(&local_90,this,(arg->id).id);
          pacVar9 = (char (*) [16])0x35c336;
          if (sVar1 == 0) {
            pacVar9 = (char (*) [16])0x35b16b;
          }
          join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                    (&local_e8,(spirv_cross *)", constant uint",pacVar9,(char (*) [3])&local_90,
                     in_R8);
          ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
      }
      local_e8._M_dataplus._M_p._0_4_ = id;
      cVar8 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(local_48,(key_type *)&local_e8);
      if (cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        sVar1 = (local_b8->array).super_VectorView<unsigned_int>.buffer_size;
        to_buffer_size_expression_abi_cxx11_(&local_90,this,id);
        pacVar9 = (char (*) [16])0x35c336;
        if (sVar1 == 0) {
          pacVar9 = (char (*) [16])0x35b16b;
        }
        join<char_const(&)[16],char_const(&)[3],std::__cxx11::string>
                  (&local_e8,(spirv_cross *)", constant uint",pacVar9,(char (*) [3])&local_90,in_R8)
        ;
        ::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_e8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      if (arg != (local_c0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr +
                 ((local_c0->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
                  buffer_size - 1)) {
        ::std::__cxx11::string::append((char *)&local_b0);
      }
      arg = arg + 1;
    } while (arg != local_50);
  }
  ::std::__cxx11::string::append((char *)&local_b0);
  CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::emit_function_prototype(SPIRFunction &func, const Bitset &)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	local_variable_names = resource_names;
	string decl;

	processing_entry_point = func.self == ir.default_entry_point;

	// Metal helper functions must be static force-inline otherwise they will cause problems when linked together in a single Metallib.
	if (!processing_entry_point)
		statement(force_inline);

	auto &type = get<SPIRType>(func.return_type);

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// We cannot return native arrays in MSL, so "return" through an out variable.
		decl += "void";
	}
	else
	{
		decl += func_type_decl(type);
	}

	decl += " ";
	decl += to_name(func.self);
	decl += "(";

	if (!type.array.empty() && msl_options.force_native_arrays)
	{
		// Fake arrays returns by writing to an out array instead.
		decl += "thread ";
		decl += type_to_glsl(type);
		decl += " (&spvReturnValue)";
		decl += type_to_array_glsl(type);
		if (!func.arguments.empty())
			decl += ", ";
	}

	if (processing_entry_point)
	{
		if (msl_options.argument_buffers)
			decl += entry_point_args_argument_buffer(!func.arguments.empty());
		else
			decl += entry_point_args_classic(!func.arguments.empty());

		// append entry point args to avoid conflicts in local variable names.
		local_variable_names.insert(resource_names.begin(), resource_names.end());

		// If entry point function has variables that require early declaration,
		// ensure they each have an empty initializer, creating one if needed.
		// This is done at this late stage because the initialization expression
		// is cleared after each compilation pass.
		for (auto var_id : vars_needing_early_declaration)
		{
			auto &ed_var = get<SPIRVariable>(var_id);
			ID &initializer = ed_var.initializer;
			if (!initializer)
				initializer = ir.increase_bound_by(1);

			// Do not override proper initializers.
			if (ir.ids[initializer].get_type() == TypeNone || ir.ids[initializer].get_type() == TypeExpression)
				set<SPIRExpression>(ed_var.initializer, "{}", ed_var.basetype, true);
		}
	}

	for (auto &arg : func.arguments)
	{
		uint32_t name_id = arg.id;

		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
		{
			// If we need to modify the name of the variable, make sure we modify the original variable.
			// Our alias is just a shadow variable.
			if (arg.alias_global_variable && var->basevariable)
				name_id = var->basevariable;

			var->parameter = &arg; // Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		}

		add_local_variable_name(name_id);

		decl += argument_decl(arg);

		bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);

		auto &arg_type = get<SPIRType>(arg.type);
		if (arg_type.basetype == SPIRType::SampledImage && !is_dynamic_img_sampler)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (auto *constexpr_sampler = find_constexpr_sampler(name_id))
				if (constexpr_sampler->ycbcr_conversion_enable)
					planes = constexpr_sampler->planes;
			for (uint32_t i = 1; i < planes; i++)
				decl += join(", ", argument_decl(arg), plane_name_suffix, i);

			// Manufacture automatic sampler arg for SampledImage texture
			if (arg_type.image.dim != DimBuffer)
			{
				if (arg_type.array.empty())
				{
					decl += join(", ", sampler_type(arg_type, arg.id), " ", to_sampler_expression(arg.id));
				}
				else
				{
					const char *sampler_address_space =
							descriptor_address_space(name_id,
							                         StorageClassUniformConstant,
							                         "thread const");
					decl += join(", ", sampler_address_space, " ", sampler_type(arg_type, arg.id), "& ", to_sampler_expression(arg.id));
				}
			}
		}

		// Manufacture automatic swizzle arg.
		if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(arg_type) &&
		    !is_dynamic_img_sampler)
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_swizzle_expression(arg.id));
		}

		if (buffer_requires_array_length(name_id))
		{
			bool arg_is_array = !arg_type.array.empty();
			decl += join(", constant uint", arg_is_array ? "* " : "& ", to_buffer_size_expression(name_id));
		}

		if (&arg != &func.arguments.back())
			decl += ", ";
	}

	decl += ")";
	statement(decl);
}